

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

void Rml::Parse::Factor(DataParser *parser)

{
  char cVar1;
  bool bVar2;
  bool *out_valid_function_name;
  Variant *this;
  char cVar3;
  bool valid_function_name;
  Variant local_98;
  String name;
  String full_address;
  ProgramState backup_state;
  
  if (parser->reached_end != false) {
LAB_00260c65:
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"literal, variable name, function name, parenthesis, or \'!\'",
               (allocator<char> *)&name);
    DataParser::Expected(parser,(String *)&local_98);
    ::std::__cxx11::string::~string((string *)&local_98);
    return;
  }
  out_valid_function_name = (bool *)parser->index;
  bVar2 = out_valid_function_name[(long)(parser->expression)._M_dataplus._M_p];
  if (bVar2 == true) {
    DataParser::Match(parser,'!',true);
    Factor(parser);
    Variant::Variant(&local_98);
    DataParser::Emit(parser,Not,&local_98);
    Variant::~Variant(&local_98);
    goto LAB_00260e2e;
  }
  if (bVar2 == true) {
    cVar1 = '\0';
    DataParser::Match(parser,'\'',false);
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    if (parser->reached_end == false) {
      cVar1 = (parser->expression)._M_dataplus._M_p[parser->index];
    }
    cVar3 = '\0';
    while ((cVar1 != '\0' && (cVar1 != '\'' || cVar3 == '\\'))) {
      bVar2 = cVar3 == '\\';
      cVar3 = cVar1;
      if ((bVar2) && ((cVar1 == '\\' || (cVar1 == '\'')))) {
        ::std::__cxx11::string::pop_back();
        cVar3 = '\0';
      }
      ::std::__cxx11::string::push_back((char)&name);
      cVar1 = DataParser::Next(parser);
    }
    Variant::Variant<std::__cxx11::string&,void>(&local_98,&name);
    DataParser::Emit(parser,Literal,&local_98);
    Variant::~Variant(&local_98);
    ::std::__cxx11::string::~string((string *)&name);
    DataParser::Match(parser,'\'',true);
    return;
  }
  if (bVar2 == true) {
LAB_00260dd4:
    FindNumberLiteral_abi_cxx11_
              (&name,(Parse *)parser,(DataParser *)0x0,SUB81(out_valid_function_name,0));
    if (name._M_string_length != 0) {
      full_address._M_dataplus._M_p = (pointer)atof(name._M_dataplus._M_p);
      Variant::Variant<double_const&,void>(&local_98,(double *)&full_address);
      DataParser::Emit(parser,Literal,&local_98);
LAB_00260e1a:
      Variant::~Variant(&local_98);
    }
  }
  else {
    if (bVar2 == true) {
      DataParser::Match(parser,'(',true);
      Expression(parser);
      DataParser::Match(parser,')',true);
      return;
    }
    out_valid_function_name = (bool *)(ulong)(bVar2 - 0x30);
    if ((byte)(bVar2 - 0x30) < 10) goto LAB_00260dd4;
    if (0x19 < (byte)((bVar2 & 0xdfU) + 0xbf)) goto LAB_00260c65;
    valid_function_name = true;
    VariableOrFunctionName_abi_cxx11_
              (&name,(Parse *)parser,(DataParser *)&valid_function_name,out_valid_function_name);
    if (name._M_string_length != 0) {
      bVar2 = ::std::operator==(&name,"true");
      if (bVar2) {
        full_address._M_dataplus._M_p._0_1_ = 1;
        Variant::Variant<bool,void>(&local_98,(bool *)&full_address);
        DataParser::Emit(parser,Literal,&local_98);
      }
      else {
        bVar2 = ::std::operator==(&name,"false");
        if (!bVar2) {
          if (parser->reached_end == false) {
            cVar1 = (parser->expression)._M_dataplus._M_p[parser->index];
            if (cVar1 == '[') {
              backup_state.program_length =
                   ((long)(parser->program).
                          super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(parser->program).
                         super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x30;
              backup_state.stack_size = parser->program_stack_size;
              VariableExpression(&full_address,parser,&name);
              if (full_address._M_string_length == 0) {
                DataParser::AddVariableAddress(parser,&name);
                Variant::Variant(&local_98);
                DataParser::Emit(parser,DynamicVariable,&local_98);
                Variant::~Variant(&local_98);
              }
              else {
                DataParser::SetProgramState(parser,&backup_state);
                DataParser::Variable(parser,&full_address);
              }
LAB_00261072:
              this = (Variant *)&full_address;
              goto LAB_00260f16;
            }
            if (cVar1 == '(') {
              if (valid_function_name == false) {
                ::std::operator+(&full_address,"Invalid function name \'",&name);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_98,&full_address,"\'.");
                DataParser::Error(parser,(String *)&local_98);
                ::std::__cxx11::string::~string((string *)&local_98);
                goto LAB_00261072;
              }
              Function(parser,TransformFnc,&name,false);
              goto LAB_00260e24;
            }
          }
          DataParser::Variable(parser,&name);
          goto LAB_00260e24;
        }
        full_address._M_dataplus._M_p = full_address._M_dataplus._M_p & 0xffffffffffffff00;
        Variant::Variant<bool,void>(&local_98,(bool *)&full_address);
        DataParser::Emit(parser,Literal,&local_98);
      }
      goto LAB_00260e1a;
    }
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Expected a variable or function name but got an empty name.",
               (allocator<char> *)&full_address);
    DataParser::Error(parser,(String *)&local_98);
    this = &local_98;
LAB_00260f16:
    ::std::__cxx11::string::~string((string *)this);
  }
LAB_00260e24:
  ::std::__cxx11::string::~string((string *)&name);
LAB_00260e2e:
  DataParser::SkipWhitespace(parser);
  return;
}

Assistant:

static void Factor(DataParser& parser)
	{
		const char c = parser.Look();

		if (c == '(')
		{
			parser.Match('(');
			Expression(parser);
			parser.Match(')');
		}
		else if (c == '\'')
		{
			parser.Match('\'', false);
			StringLiteral(parser);
			parser.Match('\'');
		}
		else if (c == '!')
		{
			Not(parser);
			parser.SkipWhitespace();
		}
		else if (c == '-' || (c >= '0' && c <= '9'))
		{
			NumberLiteral(parser);
			parser.SkipWhitespace();
		}
		else if ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z'))
		{
			VariableOrFunction(parser);
			parser.SkipWhitespace();
		}
		else
			parser.Expected("literal, variable name, function name, parenthesis, or '!'");
	}